

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TType::isImage(TType *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->field_0x8 == '\x0e') {
    iVar2 = (*this->_vptr_TType[8])();
    bVar1 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar2));
    return bVar1;
  }
  return false;
}

Assistant:

virtual bool isImage() const { return basicType == EbtSampler && getSampler().isImage(); }